

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O2

DenseSupportVectors * __thiscall
CoreML::Specification::SupportVectorRegressor::mutable_densesupportvectors
          (SupportVectorRegressor *this)

{
  DenseSupportVectors *this_00;
  
  if (this->_oneof_case_[0] == 3) {
    this_00 = (DenseSupportVectors *)(this->supportVectors_).sparsesupportvectors_;
  }
  else {
    clear_supportVectors(this);
    this->_oneof_case_[0] = 3;
    this_00 = (DenseSupportVectors *)operator_new(0x30);
    DenseSupportVectors::DenseSupportVectors(this_00);
    (this->supportVectors_).densesupportvectors_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::DenseSupportVectors* SupportVectorRegressor::mutable_densesupportvectors() {
  if (!has_densesupportvectors()) {
    clear_supportVectors();
    set_has_densesupportvectors();
    supportVectors_.densesupportvectors_ = new ::CoreML::Specification::DenseSupportVectors;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.SupportVectorRegressor.denseSupportVectors)
  return supportVectors_.densesupportvectors_;
}